

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O3

bool __thiscall QHttp2Connection::sendGOAWAY(QHttp2Connection *this,Http2Error errorCode)

{
  QHttp2Connection *this_00;
  uint uVar1;
  int __fd;
  ssize_t sVar2;
  size_t __n;
  void *__buf;
  long in_FS_OFFSET;
  uint local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this + 0x250;
  __n = 0;
  Http2::FrameWriter::start((FrameWriter *)this_00,GOAWAY,(FrameFlags)0x0,0);
  uVar1 = *(uint *)(this + 0x2ac);
  local_2c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  Http2::FrameWriter::append((FrameWriter *)this_00,(uchar *)&local_2c,(uchar *)&local_28);
  local_2c = errorCode >> 0x18 | (errorCode & 0xff0000) >> 8 | (errorCode & 0xff00) << 8 |
             errorCode << 0x18;
  Http2::FrameWriter::append((FrameWriter *)this_00,(uchar *)&local_2c,(uchar *)&local_28);
  __fd = QMetaObject::cast((QObject *)&QIODevice::staticMetaObject);
  sVar2 = Http2::FrameWriter::write((FrameWriter *)this_00,__fd,__buf,__n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return SUB81(sVar2,0);
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Connection::sendGOAWAY(Http2::Http2Error errorCode)
{
    frameWriter.start(FrameType::GOAWAY, FrameFlag::EMPTY,
                      Http2PredefinedParameters::connectionStreamID);
    frameWriter.append(quint32(m_lastIncomingStreamID));
    frameWriter.append(quint32(errorCode));
    return frameWriter.write(*getSocket());
}